

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Results-ANN-Logic-Training.cpp
# Opt level: O2

int main(void)

{
  Scalar SVar1;
  Scalar *pSVar2;
  ostream *poVar3;
  long lVar4;
  uint uVar5;
  int j;
  long lVar6;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<double> __l_08;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_09;
  initializer_list<double> __l_10;
  initializer_list<double> __l_11;
  initializer_list<double> __l_12;
  initializer_list<double> __l_13;
  initializer_list<double> __l_14;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_15;
  initializer_list<double> __l_16;
  allocator_type local_2d9;
  int local_2d8;
  allocator_type local_2d2;
  allocator_type local_2d1;
  Scalar local_2d0;
  MatrixXd se;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  or_dataset;
  undefined1 local_288 [24];
  vector<double,_std::allocator<double>_> vStack_270;
  vector<double,_std::allocator<double>_> local_258;
  vector<double,_std::allocator<double>_> local_240;
  vector<double,_std::allocator<double>_> or_labels;
  MatrixXd y;
  void *local_1f8 [3];
  MatrixXd X;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_1c8;
  LhsNested local_1a8;
  RhsNested pMStack_1a0;
  vector<double,_std::allocator<double>_> and_labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  and_dataset;
  vector<double,_std::allocator<double>_> xor_labels;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  xor_dataset;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  DenseStorage<double,__1,__1,__1,_0> local_100;
  DenseStorage<double,__1,__1,__1,_0> local_e8;
  string local_d0;
  string local_b0;
  string local_90;
  ANN n;
  
  ANN::ANN(&n);
  ANN::setInputSize(&n,2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"tanh",(allocator<char> *)local_288);
  ANN::addLayer(&n,3,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"tanh",(allocator<char> *)local_288);
  ANN::addLayer(&n,3,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"tanh",(allocator<char> *)local_288);
  ANN::addLayer(&n,1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  local_288._0_4_ = 4;
  y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data._0_4_ = 2;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&X,(int *)local_288,(int *)&y);
  local_288._0_4_ = 4;
  xor_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&y,(int *)local_288,(int *)&xor_dataset);
  xor_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  xor_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l._M_len = 2;
  __l._M_array = (iterator)&xor_labels;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_288,__l,(allocator_type *)&or_labels);
  and_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  and_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
  and_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  and_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0x3ff00000;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&and_dataset;
  std::vector<double,_std::allocator<double>_>::vector(&vStack_270,__l_00,(allocator_type *)&se);
  and_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  and_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&and_labels;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_258,__l_01,(allocator_type *)&local_1a8);
  or_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&DAT_3ff0000000000000;
  or_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_3ff0000000000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&or_dataset;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_240,__l_02,(allocator_type *)&local_1c8);
  __l_03._M_len = 4;
  __l_03._M_array = (iterator)local_288;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&xor_dataset,__l_03,(allocator_type *)local_1f8);
  lVar4 = 0x48;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)(local_288 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_288._16_8_ = &DAT_3ff0000000000000;
  vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0xbff0000000000000;
  local_288._0_8_ = (pointer)0xbff0000000000000;
  local_288._8_8_ = &DAT_3ff0000000000000;
  __l_04._M_len = 4;
  __l_04._M_array = (iterator)local_288;
  std::vector<double,_std::allocator<double>_>::vector
            (&xor_labels,__l_04,(allocator_type *)&and_dataset);
  and_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  and_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&and_labels;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_288,__l_05,
             (allocator_type *)&local_1a8);
  or_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  or_dataset.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&DAT_3ff0000000000000;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&or_dataset;
  std::vector<double,_std::allocator<double>_>::vector
            (&vStack_270,__l_06,(allocator_type *)&local_1c8);
  or_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  or_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&or_labels;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_258,__l_07,(allocator_type *)local_1f8);
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&DAT_3ff0000000000000;
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&se;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_240,__l_08,(allocator_type *)&local_2d8);
  __l_09._M_len = 4;
  __l_09._M_array = (iterator)local_288;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&and_dataset,__l_09,&local_2d9);
  lVar4 = 0x48;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)(local_288 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_288._16_8_ = (RhsNested)0xbff0000000000000;
  vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  local_288._0_8_ = (pointer)0xbff0000000000000;
  local_288._8_8_ = (LhsNested)0xbff0000000000000;
  __l_10._M_len = 4;
  __l_10._M_array = (iterator)local_288;
  std::vector<double,_std::allocator<double>_>::vector
            (&and_labels,__l_10,(allocator_type *)&or_dataset);
  or_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  or_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)&or_labels;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_288,__l_11,(allocator_type *)local_1f8
            );
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0x3ff0000000000000;
  __l_12._M_len = 2;
  __l_12._M_array = (iterator)&se;
  std::vector<double,_std::allocator<double>_>::vector
            (&vStack_270,__l_12,(allocator_type *)&local_2d8);
  local_1a8 = (LhsNested)&DAT_3ff0000000000000;
  pMStack_1a0 = (RhsNested)0x0;
  __l_13._M_len = 2;
  __l_13._M_array = (iterator)&local_1a8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_258,__l_13,(allocator_type *)&local_2d9);
  local_1c8.m_lhs = (LhsNested)&DAT_3ff0000000000000;
  local_1c8.m_rhs = (RhsNested)&DAT_3ff0000000000000;
  __l_14._M_len = 2;
  __l_14._M_array = (iterator)&local_1c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_240,__l_14,&local_2d1);
  __l_15._M_len = 4;
  __l_15._M_array = (iterator)local_288;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&or_dataset,__l_15,&local_2d2);
  lVar4 = 0x48;
  do {
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)(local_288 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  local_288._16_8_ = &DAT_3ff0000000000000;
  vStack_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  local_288._0_8_ = (pointer)0xbff0000000000000;
  local_288._8_8_ = &DAT_3ff0000000000000;
  __l_16._M_len = 4;
  __l_16._M_array = (iterator)local_288;
  std::vector<double,_std::allocator<double>_>::vector(&or_labels,__l_16,(allocator_type *)&se);
  lVar6 = 0;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    local_2d0 = **(Scalar **)
                  ((long)&((or_dataset.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + lVar6);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&X,lVar4,0);
    *pSVar2 = local_2d0;
    local_2d0 = *(Scalar *)
                 (*(long *)((long)&((or_dataset.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start + lVar6) + 8);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&X,lVar4,1);
    *pSVar2 = local_2d0;
    local_2d0 = or_labels.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar4];
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&y,lVar4,0);
    *pSVar2 = local_2d0;
    lVar6 = lVar6 + 0x18;
  }
  for (uVar5 = 0; uVar5 != 2000; uVar5 = uVar5 + 1) {
    ANN::setLearningRate(&n,0.1);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_e8,(DenseStorage<double,__1,__1,__1,_0> *)&X);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
              (&local_100,(DenseStorage<double,__1,__1,__1,_0> *)&y);
    ANN::fit(&n,(MatrixXd *)&local_e8,(MatrixXd *)&local_100);
    free(local_100.m_data);
    free(local_e8.m_data);
    if ((short)((short)((uVar5 & 0xffff) / 10) * -10 + (short)uVar5) == 0) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
                (&local_118,(DenseStorage<double,__1,__1,__1,_0> *)&X);
      ANN::predict((MatrixXd *)local_1f8,&n,(MatrixXd *)&local_118);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                (&local_1c8,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&y,
                 (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f8);
      local_1a8 = local_1c8.m_lhs;
      pMStack_1a0 = local_1c8.m_rhs;
      local_2d8 = 2;
      Eigen::
      ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>
      ::pow<int>((type *)local_288,
                 (ArrayBase<Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                  *)&local_1a8,&local_2d8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,double>,Eigen::ArrayWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,_1,0,_1,_1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&se,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_pow_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>
                  *)local_288);
      free(local_1f8[0]);
      free(local_118.m_data);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
      std::operator<<(poVar3,",");
      SVar1 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::mean
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&se);
      poVar3 = std::ostream::_M_insert<double>(SVar1);
      std::endl<char,std::char_traits<char>>(poVar3);
      free(se.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&or_labels.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&or_dataset);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&and_labels.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&and_dataset);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&xor_labels.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&xor_dataset);
  free((void *)CONCAT44(y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_data._4_4_,
                        y.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                        .m_data._0_4_));
  free(X.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  ANN::~ANN(&n);
  return 0;
}

Assistant:

int main() 
{
    ANN n = ANN();
    n.setInputSize(2);
    n.addLayer(3, "tanh");
    n.addLayer(3, "tanh");
    n.addLayer(1, "tanh");

    Eigen::MatrixXd X = Eigen::MatrixXd(4, 2);
    Eigen::MatrixXd y = Eigen::MatrixXd(4, 1);
    
    double learning_rate = 0.1;

    vector<vector<double>> xor_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> xor_labels = {-1, 1, 1, -1};

    vector<vector<double>> and_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> and_labels = {-1, -1, -1, 1};

    vector<vector<double>> or_dataset = {{0,0},{0,1},{1,0},{1,1}};
    vector<double> or_labels = {-1, 1, 1, 1};
    
    for(int j = 0; j < 4; j++) {
        X(j,0) = or_dataset[j][0];
        X(j,1) = or_dataset[j][1];
        y(j,0) = or_labels[j];
    }

    for(int i = 0; i < 2000; i++) {
        n.setLearningRate(learning_rate);
        n.fit(X, y);
        if(i % 10 == 0) {
            Eigen::MatrixXd se = (y - n.predict(X)).array().pow(2);
            cout << i << "," << se.mean() << endl;
        }
    }
    
    return 0;
}